

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dumper.c
# Opt level: O0

int yaml_emitter_dump_mapping(yaml_emitter_t *emitter,yaml_node_t *node,yaml_char_t *anchor)

{
  int iVar1;
  yaml_node_pair_t *local_b8;
  yaml_node_pair_t *pair;
  undefined1 auStack_a8 [4];
  int implicit;
  yaml_mark_t mark;
  yaml_event_t event;
  yaml_char_t *anchor_local;
  yaml_node_t *node_local;
  yaml_emitter_t *emitter_local;
  
  memset(auStack_a8,0,0x18);
  strcmp((char *)node->tag,"tag:yaml.org,2002:map");
  memset(&mark.column,0,0x68);
  mark.column._0_4_ = 9;
  iVar1 = yaml_emitter_emit(emitter,(yaml_event_t *)&mark.column);
  if (iVar1 == 0) {
    emitter_local._4_4_ = 0;
  }
  else {
    for (local_b8 = (node->data).mapping.pairs.start;
        local_b8 < (yaml_node_pair_t *)(node->data).sequence.items.top; local_b8 = local_b8 + 1) {
      iVar1 = yaml_emitter_dump_node(emitter,local_b8->key);
      if (iVar1 == 0) {
        return 0;
      }
      iVar1 = yaml_emitter_dump_node(emitter,local_b8->value);
      if (iVar1 == 0) {
        return 0;
      }
    }
    memset(&mark.column,0,0x68);
    mark.column._0_4_ = 10;
    iVar1 = yaml_emitter_emit(emitter,(yaml_event_t *)&mark.column);
    if (iVar1 == 0) {
      emitter_local._4_4_ = 0;
    }
    else {
      emitter_local._4_4_ = 1;
    }
  }
  return emitter_local._4_4_;
}

Assistant:

static int
yaml_emitter_dump_mapping(yaml_emitter_t *emitter, yaml_node_t *node,
        yaml_char_t *anchor)
{
    yaml_event_t event;
    yaml_mark_t mark  = { 0, 0, 0 };

    int implicit = (strcmp((char *)node->tag, YAML_DEFAULT_MAPPING_TAG) == 0);

    yaml_node_pair_t *pair;

    MAPPING_START_EVENT_INIT(event, anchor, node->tag, implicit,
            node->data.mapping.style, mark, mark);
    if (!yaml_emitter_emit(emitter, &event)) return 0;

    for (pair = node->data.mapping.pairs.start;
            pair < node->data.mapping.pairs.top; pair ++) {
        if (!yaml_emitter_dump_node(emitter, pair->key)) return 0;
        if (!yaml_emitter_dump_node(emitter, pair->value)) return 0;
    }

    MAPPING_END_EVENT_INIT(event, mark, mark);
    if (!yaml_emitter_emit(emitter, &event)) return 0;

    return 1;
}